

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O0

nva_card * nva_init_apu(pci_device *dev)

{
  int iVar1;
  int ret;
  nva_card *card;
  pci_device *dev_local;
  
  dev_local = (pci_device *)calloc(0x90,1);
  if (dev_local == (pci_device *)0x0) {
    dev_local = (pci_device *)0x0;
  }
  else {
    dev_local->domain_16 = 1;
    dev_local->bus = '\0';
    dev_local->dev = '\0';
    dev_local->func = '\0';
    dev_local->field_0x5 = 0;
    dev_local->vendor_id = 0;
    *(pci_device **)&dev_local->device_id = dev;
    iVar1 = pci_device_map_range
                      (dev,dev->regions[0].base_addr,dev->regions[0].size,1,
                       &dev_local->regions[0].size);
    if (iVar1 == 0) {
      *(pciaddr_t *)&dev_local->regions[0].field_0x20 = dev->regions[0].size;
    }
    else {
      fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)dev->domain,(ulong)dev->bus,
              (ulong)dev->dev,(ulong)dev->func);
      free(dev_local);
      dev_local = (pci_device *)0x0;
    }
  }
  return (nva_card *)dev_local;
}

Assistant:

struct nva_card *nva_init_apu(struct pci_device *dev) {
	struct nva_card *card = calloc(sizeof *card, 1);
	if (!card)
		return 0;
	card->type = NVA_DEVICE_APU;
	card->bus_type = NVA_BUS_PCI;
	card->bus.pci = dev;
	int ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &card->bar0);
	if (ret) {
		fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
		free(card);
		return 0;
	}
	card->bar0len = dev->regions[0].size;
	return card;
}